

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,char *fileName)

{
  bool bVar1;
  char *pcVar2;
  byte local_1e2;
  allocator local_169;
  string local_168;
  byte local_143;
  byte local_142;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *fileName_local;
  cmMakefile *this_local;
  
  local_20 = fileName;
  fileName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_DISABLE_SOURCE_CHANGES",&local_41);
  bVar1 = IsOn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pcVar2 = GetHomeDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar2,&local_79);
    pcVar2 = GetHomeOutputDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a1);
    bVar1 = cmsys::SystemTools::SameFile(&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar2 = local_20;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"CMAKE_DISABLE_IN_SOURCE_BUILD",&local_c9);
      bVar1 = IsOn(this,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      std::allocator<char>::allocator();
      local_142 = 0;
      local_143 = 0;
      std::__cxx11::string::string((string *)&local_f0,pcVar2,&local_f1);
      pcVar2 = GetHomeDirectory(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,pcVar2,&local_119);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&local_f0,&local_118);
      pcVar2 = local_20;
      local_1e2 = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_142 = 1;
        std::__cxx11::string::string((string *)&local_140,pcVar2,&local_141);
        local_143 = 1;
        pcVar2 = GetHomeOutputDirectory(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_168,pcVar2,&local_169);
        bVar1 = cmsys::SystemTools::IsSubDirectory(&local_140,&local_168);
        local_1e2 = bVar1 ^ 0xff;
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
      }
      if ((local_143 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_140);
      }
      if ((local_142 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
      }
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      if ((local_1e2 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(const char* fileName) const
{
  if ( !this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES") )
    {
    return true;
    }
  // If we are doing an in-source build, then the test will always fail
  if ( cmSystemTools::SameFile(this->GetHomeDirectory(),
                               this->GetHomeOutputDirectory()) )
    {
    if ( this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD") )
      {
      return false;
      }
    return true;
    }

  // Check if this is a subdirectory of the source tree but not a
  // subdirectory of the build tree
  if ( cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeDirectory()) &&
    !cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeOutputDirectory()) )
    {
    return false;
    }
  return true;
}